

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiPopupData *__dest;
  ImGuiWindow *pIVar6;
  ImGuiContext *ctx;
  uint uVar7;
  
  pIVar5 = GImGui;
  if (-1 < remaining) {
    if (remaining < (GImGui->OpenPopupStack).Size) {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      pIVar6 = pIVar3[(uint)remaining].Window;
      pIVar4 = pIVar3[(uint)remaining].SourceWindow;
      iVar2 = (GImGui->OpenPopupStack).Capacity;
      if (iVar2 < remaining) {
        if (iVar2 == 0) {
          uVar7 = 8;
        }
        else {
          uVar7 = iVar2 / 2 + iVar2;
        }
        if ((int)uVar7 <= remaining) {
          uVar7 = remaining;
        }
        if (iVar2 < (int)uVar7) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (ImGuiPopupData *)
                   (*GImAllocatorAllocFunc)((ulong)uVar7 * 0x30,GImAllocatorUserData);
          pIVar3 = (pIVar5->OpenPopupStack).Data;
          if (pIVar3 != (ImGuiPopupData *)0x0) {
            memcpy(__dest,pIVar3,(long)(pIVar5->OpenPopupStack).Size * 0x30);
            pIVar3 = (pIVar5->OpenPopupStack).Data;
            if ((pIVar3 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
          }
          (pIVar5->OpenPopupStack).Data = __dest;
          (pIVar5->OpenPopupStack).Capacity = uVar7;
        }
      }
      (pIVar5->OpenPopupStack).Size = remaining;
      if (restore_focus_to_window_under_popup) {
        if ((pIVar4 != (ImGuiWindow *)0x0) &&
           (pIVar6 != (ImGuiWindow *)0x0 && pIVar4->WasActive == false)) {
          FocusTopMostWindowUnderOne(pIVar6,(ImGuiWindow *)0x0);
          return;
        }
        if ((((pIVar4 == (ImGuiWindow *)0x0) || (pIVar5->NavLayer != ImGuiNavLayer_Main)) ||
            (pIVar6 = pIVar4->NavLastChildNavWindow, pIVar6 == (ImGuiWindow *)0x0)) ||
           (pIVar6->WasActive == false)) {
          pIVar6 = pIVar4;
        }
        FocusWindow(pIVar6);
        return;
      }
      return;
    }
  }
  __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0x1f5b,"void ImGui::ClosePopupToLevel(int, bool)");
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}